

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

SN_ELEMENT * __thiscall ON_SerialNumberMap::FirstElement(ON_SerialNumberMap *this)

{
  ON_SN_BLOCK *pOVar1;
  ulong uVar2;
  ON__UINT64 OVar3;
  SN_ELEMENT *pSVar4;
  
  if (this->m_snblk_list_count != 0) {
    pSVar4 = (SN_ELEMENT *)0x0;
    OVar3 = 0;
    do {
      pOVar1 = this->m_snblk_list[OVar3];
      uVar2 = (ulong)pOVar1->m_count;
      if (pOVar1->m_purged < pOVar1->m_count) {
        pSVar4 = pOVar1->m_sn;
        goto LAB_004d565f;
      }
      OVar3 = OVar3 + 1;
    } while (this->m_snblk_list_count != OVar3);
    goto LAB_004d5672;
  }
  goto LAB_004d566f;
  while( true ) {
    pSVar4 = pSVar4 + 1;
    uVar2 = uVar2 - 1;
    if (uVar2 == 0) break;
LAB_004d565f:
    if (pSVar4->m_sn_active != '\0') goto LAB_004d5672;
  }
LAB_004d566f:
  pSVar4 = (SN_ELEMENT *)0x0;
LAB_004d5672:
  pOVar1 = this->m_sn_block0;
  uVar2 = (ulong)pOVar1->m_purged;
  if ((pOVar1->m_purged < pOVar1->m_count) &&
     ((pSVar4 == (SN_ELEMENT *)0x0 || (pOVar1->m_sn0 < pSVar4->m_sn)))) {
    if (uVar2 != 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      this->m_sn_count = this->m_sn_count - uVar2;
      this->m_sn_purged = this->m_sn_purged - uVar2;
      ON_SN_BLOCK::CullBlockHelper(pOVar1);
    }
    if (this->m_sn_block0->m_sorted == 0) {
      if (this->m_bHashTableIsValid != '\0') {
        this->m_bHashTableIsValid = '\0';
      }
      ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
    }
    if ((pSVar4 == (SN_ELEMENT *)0x0) || (this->m_sn_block0->m_sn0 < pSVar4->m_sn)) {
      pSVar4 = this->m_sn_block0->m_sn;
    }
  }
  return pSVar4;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FirstElement() const
{
  SN_ELEMENT* e=nullptr;

  // The first element is likely to be m_snblk_list[0]->m_sn[0]
  // so start looking there.
  // The nullptr==e test isn't necessary. It is there to keep
  // the VisualC++ 2022 compiler from crashing.
  for(size_t i = 0; i < m_snblk_list_count && nullptr==e; i++)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      for (size_t j = 0; j < m_snblk_list[i]->m_count; j++ )
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  if ( m_sn_block0.m_count > m_sn_block0.m_purged 
       && (!e || m_sn_block0.m_sn0 < e->m_sn) 
     )
  {
    // It's possible the element is in m_sn_block0.
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort elements in m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    if ( !e || m_sn_block0.m_sn0 <  e->m_sn )
    {
      // first element in m_sn_block0 is the
      // one with the smallest serial number.
      e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[0]);
    }
  }
  return e;
}